

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeRegExp * __thiscall Parser::ParseRegExp<false>(Parser *this)

{
  BOOL BVar1;
  code *pcVar2;
  bool bVar3;
  RegexPattern *pRVar4;
  Scanner_t *pSVar5;
  undefined4 *puVar6;
  ParseNodeType *pPStack_18;
  BOOL saveDeferringAST;
  ParseNodeRegExp *pnode;
  Parser *this_local;
  
  pPStack_18 = (ParseNodeType *)0x0;
  bVar3 = IsDoingFastScan(this);
  if (bVar3) {
    pSVar5 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::RescanRegExp(pSVar5);
    BVar1 = this->m_deferringAST;
    if ((this->m_doingFastScan & 1U) != 0) {
      this->m_deferringAST = 0;
    }
    pPStack_18 = CreateNodeForOpT<(OpCode)7>(this);
    pRVar4 = Token::GetRegex((Token *)&this->m_token);
    pPStack_18->regexPattern = pRVar4;
    if ((this->m_doingFastScan & 1U) == 0) {
      bVar3 = IsBackgroundParser(this);
      if (bVar3) {
        if (pPStack_18->regexPattern != (RegexPattern *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0xf03,"(pnode->regexPattern == nullptr)",
                             "pnode->regexPattern == nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        AddBackgroundRegExpNode(this,&pPStack_18->super_ParseNode);
      }
    }
    else {
      this->m_deferringAST = BVar1;
      AddFastScannedRegExpNode(this,&pPStack_18->super_ParseNode);
      pPStack_18 = (ParseNodeType *)0x0;
    }
  }
  else {
    pSVar5 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::RescanRegExpNoAST(pSVar5);
  }
  if ((this->m_token).tk != tkRegExp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xf0c,"(m_token.tk == tkRegExp)","m_token.tk == tkRegExp");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return pPStack_18;
}

Assistant:

ParseNodeRegExp * Parser::ParseRegExp()
{
    ParseNodeRegExp * pnode = nullptr;

    if (buildAST || IsDoingFastScan())
    {
        this->GetScanner()->RescanRegExp();

#if ENABLE_BACKGROUND_PARSING
        BOOL saveDeferringAST = this->m_deferringAST;
        if (m_doingFastScan)
        {
            this->m_deferringAST = false;
        }
#endif
        pnode = CreateNodeForOpT<knopRegExp>();
        pnode->regexPattern = m_token.GetRegex();
#if ENABLE_BACKGROUND_PARSING
        if (m_doingFastScan)
        {
            this->m_deferringAST = saveDeferringAST;
            this->AddFastScannedRegExpNode(pnode);
            if (!buildAST)
            {
                pnode = nullptr;
            }
        }
        else if (this->IsBackgroundParser())
        {
            Assert(pnode->regexPattern == nullptr);
            this->AddBackgroundRegExpNode(pnode);
        }
#endif
    }
    else
    {
        this->GetScanner()->RescanRegExpNoAST();
    }
    Assert(m_token.tk == tkRegExp);

    return pnode;
}